

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderSwitchTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::evalSwitchDynamic(ShaderEvalContext *evalCtx)

{
  float *pfVar1;
  int a;
  float fVar2;
  VecAccess<float,_4,_3> local_d8;
  undefined1 local_bc [40];
  undefined1 local_94 [40];
  undefined1 local_6c [40];
  undefined1 local_44 [40];
  undefined1 local_1c [20];
  ShaderEvalContext *evalCtx_local;
  
  local_1c._12_8_ = evalCtx;
  pfVar1 = tcu::Vector<float,_4>::z(&evalCtx->coords);
  fVar2 = ::deFloatFloor(*pfVar1 * 1.5 + 2.0);
  a = (int)local_1c._12_8_;
  switch((int)fVar2) {
  case 0:
    tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_1c,a,0,1);
    tcu::Vector<float,_4>::xyz
              ((VecAccess<float,_4,_3> *)(local_44 + 0xc),(Vec4 *)(local_1c._12_8_ + 0x250));
    tcu::VecAccess<float,_4,_3>::operator=
              ((VecAccess<float,_4,_3> *)(local_44 + 0xc),(Vector<float,_3> *)local_1c);
    break;
  case 1:
    tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_44,a,3,2);
    tcu::Vector<float,_4>::xyz
              ((VecAccess<float,_4,_3> *)(local_6c + 0xc),(Vec4 *)(local_1c._12_8_ + 0x250));
    tcu::VecAccess<float,_4,_3>::operator=
              ((VecAccess<float,_4,_3> *)(local_6c + 0xc),(Vector<float,_3> *)local_44);
    break;
  case 2:
    tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_6c,a,1,2);
    tcu::Vector<float,_4>::xyz
              ((VecAccess<float,_4,_3> *)(local_94 + 0xc),(Vec4 *)(local_1c._12_8_ + 0x250));
    tcu::VecAccess<float,_4,_3>::operator=
              ((VecAccess<float,_4,_3> *)(local_94 + 0xc),(Vector<float,_3> *)local_6c);
    break;
  case 3:
    tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_94,a,2,1);
    tcu::Vector<float,_4>::xyz
              ((VecAccess<float,_4,_3> *)(local_bc + 0xc),(Vec4 *)(local_1c._12_8_ + 0x250));
    tcu::VecAccess<float,_4,_3>::operator=
              ((VecAccess<float,_4,_3> *)(local_bc + 0xc),(Vector<float,_3> *)local_94);
    break;
  default:
    tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_bc,a,0,0);
    tcu::Vector<float,_4>::xyz(&local_d8,(Vec4 *)(local_1c._12_8_ + 0x250));
    tcu::VecAccess<float,_4,_3>::operator=(&local_d8,(Vector<float,_3> *)local_bc);
  }
  return;
}

Assistant:

static void evalSwitchDynamic	(ShaderEvalContext& evalCtx)
{
	switch (int(deFloatFloor(evalCtx.coords.z()*1.5f + 2.0f)))
	{
		case 0:		evalCtx.color.xyz() = evalCtx.coords.swizzle(0,1,2);	break;
		case 1:		evalCtx.color.xyz() = evalCtx.coords.swizzle(3,2,1);	break;
		case 2:		evalCtx.color.xyz() = evalCtx.coords.swizzle(1,2,3);	break;
		case 3:		evalCtx.color.xyz() = evalCtx.coords.swizzle(2,1,0);	break;
		default:	evalCtx.color.xyz() = evalCtx.coords.swizzle(0,0,0);	break;
	}
}